

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

OptimizerResult
TasGrid::Optimizer::computeMaximum<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  OptimizerResult OVar14;
  OptimizerResult OVar15;
  anon_class_8_1_c685f059 func;
  vector<double,_std::allocator<double>_> sorted;
  double local_78;
  undefined8 uStack_70;
  anon_class_8_1_c685f059 local_48;
  _Vector_base<double,_std::allocator<double>_> local_40;
  undefined1 local_28 [16];
  double dVar10;
  
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,&current->nodes);
  ::std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_40._M_impl.super__Vector_impl_data._M_start,
             local_40._M_impl.super__Vector_impl_data._M_finish);
  uVar4 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40._M_impl.super__Vector_impl_data._M_start;
  local_48.current = current;
  OVar14 = computeMaximum<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                     (&local_48,-1.0);
  dVar10 = OVar14.value;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._0_8_ = OVar14.node;
  auVar1._12_4_ = extraout_XMM0_Dd;
  OVar15 = computeMaximum<(TasGrid::TypeOneDRule)15>::anon_class_8_1_c685f059::operator()
                     (&local_48,1.0);
  dVar11 = OVar15.value;
  uVar3 = (int)(uVar4 >> 3) - 1;
  uStack_70 = auVar1._8_8_;
  auVar13._0_8_ = ~-(ulong)(dVar10 < dVar11) & (ulong)OVar14.node;
  auVar13._8_8_ = uStack_70;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)OVar15.node & -(ulong)(dVar10 < dVar11);
  local_28 = auVar13 | auVar2;
  if (dVar11 <= dVar10) {
    dVar11 = dVar10;
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  uVar6 = local_28._0_4_;
  uVar8 = local_28._4_4_;
  dVar10 = dVar11;
  for (; uVar4 * 8 != uVar5; uVar5 = uVar5 + 8) {
    OVar14 = computeLocalMaximum<(TasGrid::TypeOneDRule)15>
                       (current,*(double *)
                                 ((long)local_40._M_impl.super__Vector_impl_data._M_start + uVar5),
                        *(double *)
                         ((long)local_40._M_impl.super__Vector_impl_data._M_start + uVar5 + 8));
    uVar7 = OVar14.node._0_4_;
    uVar9 = OVar14.node._4_4_;
    dVar12 = OVar14.value;
    if (OVar14.value <= dVar10) {
      uVar7 = uVar6;
      uVar9 = uVar8;
      dVar12 = dVar10;
    }
    uVar6 = uVar7;
    uVar8 = uVar9;
    dVar10 = dVar12;
  }
  local_78 = (double)(~-(ulong)(dVar11 < dVar10) & local_28._0_8_ |
                     CONCAT44(uVar8,uVar6) & -(ulong)(dVar11 < dVar10));
  if (dVar10 <= dVar11) {
    dVar10 = dVar11;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  OVar14.value = dVar10;
  OVar14.node = local_78;
  return OVar14;
}

Assistant:

OptimizerResult computeMaximum(CurrentNodes<rule> const& current){
    std::vector<double> sorted = current.nodes;
    std::sort(sorted.begin(), sorted.end());
    int num_intervals = (int) sorted.size() - 1;

    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    OptimizerResult max_result = func(-1.0);

    OptimizerResult right_result = func(1.0);

    if (right_result.value > max_result.value)
        max_result = right_result;

    #pragma omp parallel
    {
        OptimizerResult thread_max = max_result, thread_result;

        #pragma omp for schedule(dynamic)
        for(int i=0; i<num_intervals; i++){
            thread_result = computeLocalMaximum(current, sorted[i], sorted[i+1]);
            if ((!std::isnan(thread_result.value)) && (thread_result.value > thread_max.value))
                thread_max = thread_result;
        }

        #pragma omp critical
        {
            if (thread_max.value > max_result.value){
                max_result = thread_max;
            }
        }
    }

    return max_result;
}